

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qhash.h
# Opt level: O1

void __thiscall
QHashPrivate::Data<QHashPrivate::Node<QString,_QConfFile_*>_>::Data
          (Data<QHashPrivate::Node<QString,_QConfFile_*>_> *this,
          Data<QHashPrivate::Node<QByteArray,_QTzTimeZone>_> *other)

{
  byte bVar1;
  Span *pSVar2;
  Entry *pEVar3;
  Data *pDVar4;
  Node<QString,_QConfFile_*> *pNVar5;
  long lVar6;
  size_t sVar7;
  long lVar8;
  size_t sVar9;
  R_conflict8 RVar10;
  
  *(undefined4 *)this = 1;
  *(size_t *)(this + 8) = other->size;
  sVar7 = other->numBuckets;
  sVar9 = other->seed;
  *(size_t *)(this + 0x10) = other->numBuckets;
  *(size_t *)(this + 0x18) = sVar9;
  *(undefined8 *)(this + 0x20) = 0;
  RVar10 = allocateSpans(sVar7);
  *(Span **)(this + 0x20) = RVar10.spans;
  if (RVar10.nSpans != 0) {
    lVar6 = 0;
    sVar7 = 0;
    do {
      pSVar2 = other->spans;
      sVar9 = 0;
      do {
        bVar1 = pSVar2->offsets[sVar9 + lVar6];
        if (bVar1 != 0xff) {
          pEVar3 = pSVar2[sVar7].entries;
          lVar8 = (ulong)bVar1 * 0x20;
          pNVar5 = Span<QHashPrivate::Node<QString,_QConfFile_*>_>::insert
                             ((Span<QHashPrivate::Node<QString,_QConfFile_*>_> *)
                              (*(long *)(this + 0x20) + sVar7 * 0x90),sVar9);
          pDVar4 = *(Data **)((pEVar3->storage).data + lVar8);
          (pNVar5->key).d.d = pDVar4;
          (pNVar5->key).d.ptr = *(char16_t **)((pEVar3->storage).data + lVar8 + 8);
          (pNVar5->key).d.size = *(qsizetype *)((pEVar3->storage).data + lVar8 + 0x10);
          if (pDVar4 != (Data *)0x0) {
            LOCK();
            (pDVar4->super_QArrayData).ref_._q_value.super___atomic_base<int> =
                 (__atomic_base<int>)
                 ((__int_type_conflict)
                  (pDVar4->super_QArrayData).ref_._q_value.super___atomic_base<int> + 1);
            UNLOCK();
          }
          pNVar5->value = *(QConfFile **)((pEVar3->storage).data + lVar8 + 0x18);
        }
        sVar9 = sVar9 + 1;
      } while (sVar9 != 0x80);
      sVar7 = sVar7 + 1;
      lVar6 = lVar6 + 0x90;
    } while (sVar7 != RVar10.nSpans);
  }
  return;
}

Assistant:

Data(const Data &other) : size(other.size), numBuckets(other.numBuckets), seed(other.seed)
    {
        auto r = allocateSpans(numBuckets);
        spans = r.spans;
        reallocationHelper<false>(other, r.nSpans);
    }